

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_callbacks(App *this)

{
  bool bVar1;
  ulong uVar2;
  reference this_00;
  pointer pOVar3;
  size_t sVar4;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  App_p *sub_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2_2;
  Option_p *opt;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2_1;
  App_p *sub;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2;
  App *this_local;
  
  __end2 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
           begin(&this->subcommands_);
  sub = (App_p *)std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ::end(&this->subcommands_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                     *)&sub), bVar1) {
    p_Var5 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
             ::operator*(&__end2);
    peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var5);
    get_name_abi_cxx11_(peVar6);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var5);
      bVar1 = ::std::function::operator_cast_to_bool((function *)&peVar6->parse_complete_callback_);
      if (bVar1) {
        peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var5);
        sVar4 = count_all(peVar6);
        if (sVar4 != 0) {
          peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var5);
          _process_callbacks(peVar6);
          peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var5);
          run_callback(peVar6,false);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ::begin(&this->options_);
  opt = (Option_p *)
        std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::end(&this->options_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                             *)&opt), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
              ::operator*(&__end2_1);
    pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_00);
    sVar4 = Option::count(pOVar3);
    if (sVar4 != 0) {
      pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_00);
      bVar1 = Option::get_callback_run(pOVar3);
      if (!bVar1) {
        pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (this_00);
        Option::run_callback(pOVar3);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&this->subcommands_);
  sub_1 = (App_p *)std::
                   vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
                   end(&this->subcommands_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)&sub_1), bVar1) {
    p_Var5 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
             ::operator*(&__end2_2);
    peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var5);
    bVar1 = ::std::function::operator_cast_to_bool((function *)&peVar6->parse_complete_callback_);
    if (!bVar1) {
      peVar6 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var5);
      _process_callbacks(peVar6);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end2_2);
  }
  return;
}

Assistant:

void _process_callbacks() {

        for(App_p &sub : subcommands_) {
            // process the priority option_groups first
            if(sub->get_name().empty() && sub->parse_complete_callback_) {
                if(sub->count_all() > 0) {
                    sub->_process_callbacks();
                    sub->run_callback();
                }
            }
        }

        for(const Option_p &opt : options_) {
            if(opt->count() > 0 && !opt->get_callback_run()) {
                opt->run_callback();
            }
        }
        for(App_p &sub : subcommands_) {
            if(!sub->parse_complete_callback_) {
                sub->_process_callbacks();
            }
        }
    }